

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void __thiscall AActor::RemoveFromHash(AActor *this)

{
  AActor *pAVar1;
  
  if ((this->tid != 0) && (this->iprev != (AActor **)0x0)) {
    pAVar1 = this->inext;
    *this->iprev = pAVar1;
    if (pAVar1 != (AActor *)0x0) {
      pAVar1->iprev = this->iprev;
    }
    this->inext = (AActor *)0x0;
    this->iprev = (AActor **)0x0;
  }
  this->tid = 0;
  return;
}

Assistant:

void AActor::RemoveFromHash ()
{
	if (tid != 0 && iprev)
	{
		*iprev = inext;
		if (inext)
		{
			inext->iprev = iprev;
		}
		iprev = NULL;
		inext = NULL;
	}
	tid = 0;
}